

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O0

void __thiscall Refal2::CReceptacle::Copy(CReceptacle *this,CUnitList *key,CUnitList *value)

{
  bool bVar1;
  CNodeType *key_00;
  CUnitNode **ppCVar2;
  CUnitNode *local_48;
  CUnitNode *last;
  CUnitNode *first;
  CUnitNode *rightBorderNode;
  CUnitNode *equalNode;
  CUnitNode *leftBorderNode;
  CUnitList *value_local;
  CUnitList *key_local;
  CReceptacle *this_local;
  
  equalNode = (CUnitNode *)0x0;
  rightBorderNode = (CUnitNode *)0x0;
  leftBorderNode = (CUnitNode *)value;
  value_local = key;
  key_local = &this->data;
  key_00 = CNodeList<Refal2::CUnit>::GetFirst(&key->super_CNodeList<Refal2::CUnit>);
  bVar1 = find(this,key_00,&equalNode,&rightBorderNode);
  if (bVar1) {
    ppCVar2 = CUnit::PairedParen(&equalNode->super_CUnit);
    first = *ppCVar2;
    rightBorderNode = CNode<Refal2::CUnit>::Next(rightBorderNode);
    if (rightBorderNode != first) {
      first = CNode<Refal2::CUnit>::Prev(first);
      last = (CUnitNode *)0x0;
      local_48 = (CNodeType *)0x0;
      CUnitList::Duplicate(&this->data,rightBorderNode,first,&last,&local_48);
      CNodeList<Refal2::CUnit>::Assign((CNodeList<Refal2::CUnit> *)leftBorderNode,last,local_48);
      return;
    }
  }
  CNodeList<Refal2::CUnit>::Empty((CNodeList<Refal2::CUnit> *)leftBorderNode);
  return;
}

Assistant:

void CReceptacle::Copy( const CUnitList& key, CUnitList& value )
{
	CUnitNode* leftBorderNode = nullptr;
	CUnitNode* equalNode = nullptr;
	if( find( key.GetFirst(), leftBorderNode, equalNode ) ) {
		CUnitNode* rightBorderNode = leftBorderNode->PairedParen();
		equalNode = equalNode->Next();
		if( equalNode != rightBorderNode ) {
			rightBorderNode = rightBorderNode->Prev();
			CUnitNode* first = nullptr;
			CUnitNode* last = nullptr;
			data.Duplicate( equalNode, rightBorderNode, first, last );
			value.Assign( first, last );
			return;
		}
	}
	value.Empty();
}